

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int isoent_gen_iso9660_identifier(archive_write *a,isoent *isoent,idr *idr)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  byte *__dest;
  size_t sVar8;
  undefined1 *puVar9;
  long in_RDX;
  long in_RSI;
  archive *in_RDI;
  int off;
  int xdoff;
  int extlen;
  int nammax;
  int weight;
  int noff;
  int ext_off;
  char *xdot;
  char *dot;
  int dnmax;
  int ffmax;
  int fnmax;
  char allow_vernum;
  char allow_period;
  char allow_multidot;
  char allow_ldots;
  char *char_map;
  int r;
  int l;
  char *p;
  isoent *np;
  iso9660_conflict *iso9660;
  int in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  int in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  int local_6c;
  byte *local_68;
  archive_rb_tree_ops *in_stack_ffffffffffffffa0;
  byte *__s;
  int local_58;
  int local_54;
  int local_50;
  byte local_4c;
  byte *local_38;
  long local_30;
  int local_4;
  
  if (*(int *)(in_RSI + 0x38) == 0) {
    local_4 = 0;
  }
  else {
    lVar1 = *(long *)&in_RDI[1].current_codepage;
    if ((*(uint *)(lVar1 + 0x10370) >> 0xe & 7) < 4) {
      bVar4 = false;
      bVar5 = false;
      bVar6 = true;
      local_4c = (byte)(*(uint *)(lVar1 + 0x10370) >> 2) & 1;
      if ((*(uint *)(lVar1 + 0x10370) >> 0xe & 7) == 1) {
        local_50 = 8;
        local_54 = 0xc;
        local_58 = 8;
      }
      else {
        local_50 = 0x1e;
        local_54 = 0x1f;
        local_58 = 0x1f;
      }
    }
    else {
      bVar5 = true;
      bVar4 = true;
      local_4c = 0;
      bVar6 = false;
      if ((*(uint *)(lVar1 + 0x10370) >> 0x17 & 3) == 0) {
        local_58 = 0xcf;
        local_54 = 0xcf;
        local_50 = 0xcf;
      }
      else {
        local_58 = 0xc1;
        local_54 = 0xc1;
        local_50 = 0xc1;
      }
    }
    local_4 = idr_start((archive_write *)
                        CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                        (idr *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                        in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,
                        in_stack_ffffffffffffff74,in_stack_ffffffffffffff70,
                        in_stack_ffffffffffffffa0);
    if (-1 < local_4) {
      for (local_30 = *(long *)(in_RSI + 0x28); local_30 != 0; local_30 = *(long *)(local_30 + 0x70)
          ) {
        local_6c = (int)*(undefined8 *)(*(long *)(local_30 + 0x18) + 0x48);
        __dest = (byte *)malloc((long)(local_6c + 0x22));
        if (__dest == (byte *)0x0) {
          archive_set_error(in_RDI,0xc,"Can\'t allocate memory");
          return -0x1e;
        }
        memcpy(__dest,*(void **)(*(long *)(local_30 + 0x18) + 0x40),(long)local_6c);
        __dest[local_6c] = 0;
        *(byte **)(local_30 + 0xa8) = __dest;
        local_68 = (byte *)0x0;
        __s = (byte *)0x0;
        local_38 = __dest;
        if ((!bVar4) && (*__dest == 0x2e)) {
          local_38 = __dest + 1;
          *__dest = 0x5f;
        }
        for (; *local_38 != 0; local_38 = local_38 + 1) {
          if (((int)(char)*local_38 & 0x80U) == 0) {
            if (*(char *)(in_RDX + 0x38 + (ulong)*local_38) == '\0') {
              if (((char)*local_38 < 'a') || ('z' < (char)*local_38)) {
                if ((*local_38 != 0x2e) || (local_68 = __s, __s = local_38, !bVar5)) {
                  *local_38 = 0x5f;
                }
              }
              else {
                *local_38 = *local_38 - 0x20;
              }
            }
            else if (*local_38 == 0x2e) {
              local_68 = __s;
              __s = local_38;
            }
          }
          else {
            *local_38 = 0x5f;
          }
        }
        lVar2 = *(long *)(local_30 + 0xa8);
        if (__s == (byte *)0x0) {
          iVar7 = local_50;
          if ((char)(*(char *)(local_30 + 0xe8) << 6) < '\0') {
            iVar7 = local_58;
          }
          if (iVar7 < local_6c) {
            *(undefined1 *)(lVar2 + iVar7) = 0;
            local_6c = iVar7;
          }
        }
        else {
          *__s = 0x2e;
          iVar7 = (int)__s - (int)lVar2;
          if ((*(uint *)(lVar1 + 0x10370) >> 0xe & 7) == 1) {
            if ((long)__s - lVar2 < 9) {
              sVar8 = strlen((char *)__s);
              local_6c = iVar7;
              if (4 < sVar8) {
                __s[4] = 0;
              }
            }
            else {
              *(byte *)(lVar2 + 8) = *__s;
              *(byte *)(lVar2 + 9) = __s[1];
              *(byte *)(lVar2 + 10) = __s[2];
              *(byte *)(lVar2 + 0xb) = __s[3];
              *(undefined1 *)(lVar2 + 0xc) = 0;
              local_6c = 8;
            }
          }
          else if ((char)(*(char *)(local_30 + 0xe8) << 6) < '\0') {
            bVar3 = local_58 < local_6c;
            local_6c = iVar7;
            if ((bVar3) && (*(undefined1 *)(lVar2 + local_58) = 0, local_58 < iVar7)) {
              local_6c = local_58;
            }
          }
          else {
            bVar3 = local_54 < local_6c;
            local_6c = iVar7;
            if (bVar3) {
              sVar8 = strlen((char *)__s);
              in_stack_ffffffffffffff84 = (int)sVar8;
              if (local_68 == (byte *)0x0) {
                in_stack_ffffffffffffff80 = 0;
              }
              else {
                in_stack_ffffffffffffff80 = (int)local_68 - (int)lVar2;
              }
              if ((in_stack_ffffffffffffff84 < 2) || (local_50 + -1 <= in_stack_ffffffffffffff80)) {
                *(undefined1 *)(lVar2 + local_50) = 0;
                local_6c = local_50;
              }
              else {
                if (local_54 < in_stack_ffffffffffffff84) {
                  in_stack_ffffffffffffff84 = local_54;
                }
                in_stack_ffffffffffffff7c = local_54 - in_stack_ffffffffffffff84;
                if (in_stack_ffffffffffffff7c == 0) {
                  in_stack_ffffffffffffff7c = 1;
                  in_stack_ffffffffffffff84 = in_stack_ffffffffffffff84 + -1;
                }
                memmove((void *)(lVar2 + in_stack_ffffffffffffff7c),__s,
                        (long)in_stack_ffffffffffffff84);
                *(undefined1 *)(lVar2 + local_54) = 0;
                local_6c = in_stack_ffffffffffffff7c;
              }
            }
          }
        }
        *(int *)(local_30 + 0xb0) = local_6c;
        sVar8 = strlen((char *)(lVar2 + local_6c));
        *(int *)(local_30 + 0xb4) = (int)sVar8;
        *(int *)(local_30 + 0xb8) = local_6c + *(int *)(local_30 + 0xb4);
        idr_register((idr *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                     (isoent *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                     in_stack_ffffffffffffff74,in_stack_ffffffffffffff70);
      }
      idr_resolve((idr *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                  (_func_void_uchar_ptr_int *)
                  CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      for (local_30 = *(long *)(in_RSI + 0x28); local_30 != 0; local_30 = *(long *)(local_30 + 0x70)
          ) {
        if (((char)(*(char *)(local_30 + 0xe8) << 6) < '\0') || (*(long *)(local_30 + 200) != 0)) {
          *(int *)(local_30 + 0xb8) = *(int *)(local_30 + 0xb0) + *(int *)(local_30 + 0xb4);
        }
        else {
          puVar9 = (undefined1 *)
                   (*(long *)(local_30 + 0xa8) + (long)*(int *)(local_30 + 0xb0) +
                   (long)*(int *)(local_30 + 0xb4));
          local_38 = puVar9;
          if ((*(int *)(local_30 + 0xb4) == 0) && (bVar6)) {
            local_38 = puVar9 + 1;
            *puVar9 = 0x2e;
            *(undefined4 *)(local_30 + 0xb4) = 1;
          }
          if ((*(int *)(local_30 + 0xb4) == 1) && (!bVar6)) {
            local_38[-1] = 0;
            *(undefined4 *)(local_30 + 0xb4) = 0;
            local_38 = local_38 + -1;
          }
          *(int *)(local_30 + 0xb8) = *(int *)(local_30 + 0xb0) + *(int *)(local_30 + 0xb4);
          if (local_4c != 0) {
            puVar9 = local_38 + 1;
            *local_38 = 0x3b;
            local_38 = local_38 + 2;
            *puVar9 = 0x31;
            *(int *)(local_30 + 0xb8) = *(int *)(local_30 + 0xb8) + 2;
          }
          *local_38 = 0;
        }
        *(undefined4 *)(local_30 + 0xbc) = *(undefined4 *)(local_30 + 0xb8);
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static int
isoent_gen_iso9660_identifier(struct archive_write *a, struct isoent *isoent,
    struct idr *idr)
{
	struct iso9660 *iso9660;
	struct isoent *np;
	char *p;
	int l, r;
	const char *char_map;
	char allow_ldots, allow_multidot, allow_period, allow_vernum;
	int fnmax, ffmax, dnmax;
	static const struct archive_rb_tree_ops rb_ops = {
		isoent_cmp_node_iso9660, isoent_cmp_key_iso9660
	};

	if (isoent->children.cnt == 0)
		return (0);

	iso9660 = a->format_data;
	char_map = idr->char_map;
	if (iso9660->opt.iso_level <= 3) {
		allow_ldots = 0;
		allow_multidot = 0;
		allow_period = 1;
		allow_vernum = iso9660->opt.allow_vernum;
		if (iso9660->opt.iso_level == 1) {
			fnmax = 8;
			ffmax = 12;/* fnmax + '.' + 3 */
			dnmax = 8;
		} else {
			fnmax = 30;
			ffmax = 31;
			dnmax = 31;
		}
	} else {
		allow_ldots = allow_multidot = 1;
		allow_period = allow_vernum = 0;
		if (iso9660->opt.rr)
			/*
			 * MDR : The maximum size of Directory Record(254).
			 * DRL : A Directory Record Length(33).
			 * CE  : A size of SUSP CE System Use Entry(28).
			 * MDR - DRL - CE = 254 - 33 - 28 = 193.
			 */
			fnmax = ffmax = dnmax = 193;
		else
			/*
			 * XA  : CD-ROM XA System Use Extension
			 *       Information(14).
			 * MDR - DRL - XA = 254 - 33 -14 = 207.
			 */
			fnmax = ffmax = dnmax = 207;
	}

	r = idr_start(a, idr, isoent->children.cnt, ffmax, 3, 1, &rb_ops);
	if (r < 0)
		return (r);

	for (np = isoent->children.first; np != NULL; np = np->chnext) {
		char *dot, *xdot;
		int ext_off, noff, weight;

		l = (int)np->file->basename.length;
		p = malloc(l+31+2+1);
		if (p == NULL) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory");
			return (ARCHIVE_FATAL);
		}
		memcpy(p, np->file->basename.s, l);
		p[l] = '\0';
		np->identifier = p;

		dot = xdot = NULL;
		if (!allow_ldots) {
			/*
			 * If there is a '.' character at the first byte,
			 * it has to be replaced by '_' character.
			 */
			if (*p == '.')
				*p++ = '_';
		}
		for (;*p; p++) {
			if (*p & 0x80) {
				*p = '_';
				continue;
			}
			if (char_map[(unsigned char)*p]) {
				/* if iso-level is '4', a character '.' is
				 * allowed by char_map. */
				if (*p == '.') {
					xdot = dot;
					dot = p;
				}
				continue;
			}
			if (*p >= 'a' && *p <= 'z') {
				*p -= 'a' - 'A';
				continue;
			}
			if (*p == '.') {
				xdot = dot;
				dot = p;
				if (allow_multidot)
					continue;
			}
			*p = '_';
		}
		p = np->identifier;
		weight = -1;
		if (dot == NULL) {
			int nammax;

			if (np->dir)
				nammax = dnmax;
			else
				nammax = fnmax;

			if (l > nammax) {
				p[nammax] = '\0';
				weight = nammax;
				ext_off = nammax;
			} else
				ext_off = l;
		} else {
			*dot = '.';
			ext_off = (int)(dot - p);

			if (iso9660->opt.iso_level == 1) {
				if (dot - p <= 8) {
					if (strlen(dot) > 4) {
						/* A length of a file extension
						 * must be less than 4 */
						dot[4] = '\0';
						weight = 0;
					}
				} else {
					p[8] = dot[0];
					p[9] = dot[1];
					p[10] = dot[2];
					p[11] = dot[3];
					p[12] = '\0';
					weight = 8;
					ext_off = 8;
				}
			} else if (np->dir) {
				if (l > dnmax) {
					p[dnmax] = '\0';
					weight = dnmax;
					if (ext_off > dnmax)
						ext_off = dnmax;
				}
			} else if (l > ffmax) {
				int extlen = (int)strlen(dot);
				int xdoff;

				if (xdot != NULL)
					xdoff = (int)(xdot - p);
				else
					xdoff = 0;

				if (extlen > 1 && xdoff < fnmax-1) {
					int off;

					if (extlen > ffmax)
						extlen = ffmax;
					off = ffmax - extlen;
					if (off == 0) {
						/* A dot('.')  character
						 * does't place to the first
						 * byte of identifier. */
						off ++;
						extlen --;
					}
					memmove(p+off, dot, extlen);
					p[ffmax] = '\0';
					ext_off = off;
					weight = off;
#ifdef COMPAT_MKISOFS
				} else if (xdoff >= fnmax-1) {
					/* Simulate a bug(?) of mkisofs. */
					p[fnmax-1] = '\0';
					ext_off = fnmax-1;
					weight = fnmax-1;
#endif
				} else {
					p[fnmax] = '\0';
					ext_off = fnmax;
					weight = fnmax;
				}
			}
		}
		/* Save an offset of a file name extension to sort files. */
		np->ext_off = ext_off;
		np->ext_len = (int)strlen(&p[ext_off]);
		np->id_len = l = ext_off + np->ext_len;

		/* Make an offset of the number which is used to be set
		 * hexadecimal number to avoid duplicate identififier. */
		if (iso9660->opt.iso_level == 1) {
			if (ext_off >= 5)
				noff = 5;
			else
				noff = ext_off;
		} else {
			if (l == ffmax)
				noff = ext_off - 3;
			else if (l == ffmax-1)
				noff = ext_off - 2;
			else if (l == ffmax-2)
				noff = ext_off - 1;
			else
				noff = ext_off;
		}
		/* Register entry to the identifier resolver. */
		idr_register(idr, np, weight, noff);
	}

	/* Resolve duplicate identifier. */
	idr_resolve(idr, idr_set_num);

	/* Add a period and a version number to identifiers. */
	for (np = isoent->children.first; np != NULL; np = np->chnext) {
		if (!np->dir && np->rr_child == NULL) {
			p = np->identifier + np->ext_off + np->ext_len;
			if (np->ext_len == 0 && allow_period) {
				*p++ = '.';
				np->ext_len = 1;
			}
			if (np->ext_len == 1 && !allow_period) {
				*--p = '\0';
				np->ext_len = 0;
			}
			np->id_len = np->ext_off + np->ext_len;
			if (allow_vernum) {
				*p++ = ';';
				*p++ = '1';
				np->id_len += 2;
			}
			*p = '\0';
		} else
			np->id_len = np->ext_off + np->ext_len;
		np->mb_len = np->id_len;
	}
	return (ARCHIVE_OK);
}